

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void __thiscall cppcms::json::value::at(value *this,char *cpath,value *v)

{
  variant *this_00;
  value vVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
  *this_01;
  iterator iVar3;
  char *pcVar4;
  bad_value_cast *this_02;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_bool>
  pVar10;
  string_key path;
  value local_f0;
  key_type local_e8;
  char *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  char *local_a8;
  long local_a0;
  char local_98 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
  local_88;
  undefined8 uStack_60;
  string local_58;
  value *local_38;
  
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(cpath + -1);
  do {
    pcVar4 = local_b0->_M_local_buf + 1;
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_b0->_M_local_buf + 1);
  } while (*pcVar4 != '\0');
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = '\0';
  uVar7 = 0;
  local_b8 = cpath;
  local_38 = v;
  do {
    pcVar4 = local_b8;
    local_e8.end_ = (char *)local_b0;
    if (local_b8 == (char *)0x0) {
      pcVar4 = local_a8;
      local_e8.end_ = (char *)(local_a8 + local_a0);
    }
    uVar9 = (long)local_e8.end_ - (long)pcVar4;
    uVar5 = 0xffffffffffffffff;
    uVar6 = uVar7;
    if (uVar7 < uVar9) {
      do {
        uVar5 = uVar6;
        if (pcVar4[uVar6] == '.') break;
        uVar5 = uVar6 + 1;
        uVar6 = uVar5;
      } while (uVar5 <= uVar9);
      if (uVar9 <= uVar5) {
        uVar5 = 0xffffffffffffffff;
      }
    }
    if (uVar7 < uVar9) {
      local_e8.begin_ = pcVar4 + uVar7;
      if (uVar5 - uVar7 <= (ulong)((long)local_e8.end_ - (long)local_e8.begin_)) {
        local_e8.end_ = pcVar4 + uVar5;
      }
    }
    else {
      local_e8.begin_ = (char *)0x0;
      local_e8.end_ = (char *)0x0;
    }
    local_e8.key_._M_dataplus._M_p = (pointer)&local_e8.key_.field_2;
    local_e8.key_._M_string_length = 0;
    local_e8.key_.field_2._M_local_buf[0] = '\0';
    uVar7 = uVar5 + 1;
    if (uVar7 == 0) {
      uVar7 = 0xffffffffffffffff;
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8.key_._M_dataplus._M_p;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8.key_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.begin_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8.begin_;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8.end_;
    }
    if (paVar8 == paVar2) {
      this_02 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Invalid path provided","");
      bad_value_cast::bad_value_cast(this_02,&local_88.first);
      __cxa_throw(this_02,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if (*(int *)&(*(_Base_ptr *)this)[1]._M_left != 5) {
      local_88.first.field_2._M_allocated_capacity = 0;
      local_88.first._M_dataplus._M_p = (pointer)0x0;
      local_88.first._M_string_length = 0;
      local_88.first.field_2._8_8_ = &local_88.first._M_string_length;
      uStack_60 = 0;
      local_88.second.d.d.ptr_ = (copyable)(copyable)local_88.first.field_2._8_8_;
      value<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                ((value *)&local_58,
                 (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                  *)&local_88);
      this_00 = *(variant **)this;
      *this = (value)local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)this_00;
      if (this_00 != (variant *)0x0) {
        variant::destroy(this_00);
        operator_delete(this_00);
      }
      std::
      _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
      ::~_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                   *)&local_88);
    }
    this_01 = (_Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
               *)variant::
                 get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                           (*(variant **)this);
    iVar3 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                    *)this_01,&local_e8);
    if (iVar3._M_node == (_Base_ptr)(this_01 + 8)) {
      string_key::str_abi_cxx11_(&local_58,&local_e8);
      local_f0.d.d.ptr_ = (copyable)operator_new(0x38);
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x20) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x28) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x10) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x18) = 0;
      *(undefined8 *)local_f0.d.d.ptr_ = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 8) = 0;
      *(undefined8 *)((long)local_f0.d.d.ptr_ + 0x30) = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value,_true>
                (&local_88,&local_58,&local_f0);
      pVar10 = std::
               _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,cppcms::json::value>>
                         (this_01,&local_88);
      vVar1.d.d.ptr_ = local_88.second.d.d.ptr_;
      iVar3._M_node = (_Base_ptr)pVar10.first._M_node;
      if (local_88.second.d.d.ptr_ != (copy_ptr<cppcms::json::value::_data>)0x0) {
        variant::destroy((variant *)local_88.second.d.d.ptr_);
        operator_delete((void *)vVar1.d.d.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
        operator_delete(local_88.first._M_dataplus._M_p);
      }
      vVar1.d.d.ptr_ = local_f0.d.d.ptr_;
      if (local_f0.d.d.ptr_ != (copy_ptr<cppcms::json::value::_data>)0x0) {
        variant::destroy((variant *)local_f0.d.d.ptr_);
        operator_delete((void *)vVar1.d.d.ptr_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.key_._M_dataplus._M_p != &local_e8.key_.field_2) {
      operator_delete(local_e8.key_._M_dataplus._M_p);
    }
    pcVar4 = local_b8;
    paVar2 = local_b0;
    if (local_b8 == (char *)0x0) {
      pcVar4 = local_a8;
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_a8 + local_a0);
    }
    this = (value *)&iVar3._M_node[2]._M_left;
    if ((ulong)((long)paVar2 - (long)pcVar4) <= uVar7) {
      if (this != local_38) {
        booster::copy_ptr<cppcms::json::value::_data>::operator=
                  ((copy_ptr<cppcms::json::value::_data> *)this,
                   (copy_ptr<cppcms::json::value::_data> *)local_38);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      return;
    }
  } while( true );
}

Assistant:

void value::at(char const *cpath,value const &v)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);


			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object) {
				*ptr=json::object();
			}
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end()) {
				ptr=&obj.insert(std::make_pair(part.str(),json::value())).first->second;
			}
			else
				ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		*ptr=v;
	}